

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg.c
# Opt level: O0

void aom_hadamard_4x4_c(int16_t *src_diff,ptrdiff_t src_stride,tran_low_t *coeff)

{
  long in_RDX;
  ptrdiff_t in_RSI;
  int16_t *in_RDI;
  int j;
  int i;
  int16_t *tmp_buf;
  int16_t buffer2 [16];
  int16_t buffer [16];
  int idx;
  int local_78;
  int local_74;
  int16_t *local_70;
  int16_t local_68 [16];
  int16_t local_48 [22];
  int local_1c;
  long local_18;
  ptrdiff_t local_10;
  int16_t *local_8;
  
  local_70 = local_48;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  for (local_1c = 0; local_1c < 4; local_1c = local_1c + 1) {
    hadamard_col4(local_8,local_10,local_70);
    local_70 = local_70 + 4;
    local_8 = local_8 + 1;
  }
  local_70 = local_48;
  for (local_1c = 0; local_1c < 4; local_1c = local_1c + 1) {
    hadamard_col4(local_70,4,local_68 + (local_1c << 2));
    local_70 = local_70 + 1;
  }
  for (local_74 = 0; local_74 < 4; local_74 = local_74 + 1) {
    for (local_78 = 0; local_78 < 4; local_78 = local_78 + 1) {
      *(int *)(local_18 + (long)(local_74 * 4 + local_78) * 4) =
           (int)local_68[local_78 * 4 + local_74];
    }
  }
  return;
}

Assistant:

void aom_hadamard_4x4_c(const int16_t *src_diff, ptrdiff_t src_stride,
                        tran_low_t *coeff) {
  int idx;
  int16_t buffer[16];
  int16_t buffer2[16];
  int16_t *tmp_buf = &buffer[0];
  for (idx = 0; idx < 4; ++idx) {
    hadamard_col4(src_diff, src_stride, tmp_buf);  // src_diff: 9 bit
                                                   // dynamic range [-255, 255]
    tmp_buf += 4;
    ++src_diff;
  }

  tmp_buf = &buffer[0];
  for (idx = 0; idx < 4; ++idx) {
    hadamard_col4(tmp_buf, 4, buffer2 + 4 * idx);  // tmp_buf: 12 bit
    // dynamic range [-2040, 2040]
    // buffer2: 15 bit
    // dynamic range [-16320, 16320]
    ++tmp_buf;
  }

  // Extra transpose to match SSE2 behavior(i.e., aom_hadamard_4x4_sse2).
  for (int i = 0; i < 4; i++) {
    for (int j = 0; j < 4; j++) {
      coeff[i * 4 + j] = (tran_low_t)buffer2[j * 4 + i];
    }
  }
}